

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O1

void __thiscall libtorrent::mmap_disk_io::add_completed_jobs(mmap_disk_io *this,jobqueue_t *jobs)

{
  jobqueue_t new_jobs;
  jobqueue_t local_48;
  jobqueue_t local_30;
  
  local_30.m_first = jobs->m_first;
  local_30.m_last = jobs->m_last;
  local_30.m_size = jobs->m_size;
  jobs->m_first = (disk_job *)0x0;
  jobs->m_last = (disk_job *)0x0;
  jobs->m_size = 0;
  do {
    local_48.m_first = (disk_job *)0x0;
    local_48.m_last = (disk_job *)0x0;
    local_48.m_size = 0;
    add_completed_jobs_impl(this,&local_30,&local_48);
    local_30.m_first = local_48.m_first;
    local_30.m_last = local_48.m_last;
    local_30.m_size = local_48.m_size;
  } while (local_48.m_size != 0);
  return;
}

Assistant:

void mmap_disk_io::add_completed_jobs(jobqueue_t jobs)
	{
		jobqueue_t completed = std::move(jobs);
		do
		{
			// when a job completes, it's possible for it to cause
			// a fence to be lowered, issuing the jobs queued up
			// behind the fence
			jobqueue_t new_jobs;
			add_completed_jobs_impl(std::move(completed), new_jobs);
			TORRENT_ASSERT(completed.empty());
			completed = std::move(new_jobs);
		} while (!completed.empty());
	}